

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  ushort **ppuVar5;
  char *pcVar7;
  short sVar8;
  long lVar9;
  char *pcVar10;
  ushort uVar11;
  ushort *puVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  ushort *puVar6;
  
  pcVar14 = zSrc + nLen;
  bVar15 = false;
  if (nLen != 0) {
    ppuVar5 = __ctype_b_loc();
    do {
      cVar1 = *zSrc;
      if ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if ((cVar1 == '+') || (cVar1 == '-')) {
          bVar15 = cVar1 == '-';
          goto LAB_0011bfc2;
        }
        break;
      }
      zSrc = zSrc + 1;
    } while (zSrc < pcVar14);
  }
  for (; (zSrc < pcVar14 && (*zSrc == '0')); zSrc = zSrc + 1) {
LAB_0011bfc2:
  }
  uVar4 = (int)pcVar14 - (int)zSrc;
  uVar11 = 0x13;
  if (0x12 < uVar4) {
    pcVar7 = "9223372036854775808";
    if (!bVar15) {
      pcVar7 = "9223372036854775807";
    }
    uVar4 = SyMemcmp(zSrc,pcVar7,0x13);
    uVar11 = (int)uVar4 < 1 | 0x12;
  }
  puVar6 = (ushort *)(ulong)uVar4;
  if (zSrc < pcVar14) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    lVar9 = 0;
    puVar12 = (ushort *)0x0;
    pcVar10 = zSrc;
    do {
      if ((*(byte *)((long)puVar6 + (long)zSrc[lVar9] * 2 + 1) & 8) == 0) {
        pcVar7 = zSrc + lVar9;
        goto LAB_0011c125;
      }
      puVar12 = (ushort *)(((long)zSrc[lVar9] + (long)puVar12 * 10) - 0x30);
      pcVar7 = zSrc + lVar9 + 1;
      if ((pcVar14 <= pcVar7) || (sVar8 = (short)lVar9, (ushort)(uVar11 - 1) == sVar8))
      goto LAB_0011c125;
      if ((*(byte *)((long)puVar6 + (long)*pcVar7 * 2 + 1) & 8) == 0) {
        pcVar7 = pcVar10 + 1;
        goto LAB_0011c125;
      }
      puVar12 = (ushort *)(((long)*pcVar7 + (long)puVar12 * 10) - 0x30);
      pcVar13 = zSrc + lVar9 + 2;
      pcVar7 = pcVar10 + 2;
      if (((pcVar14 <= pcVar13) || ((ushort)(uVar11 - 2) == sVar8)) ||
         (pcVar7 = pcVar13, (*(byte *)((long)puVar6 + (long)*pcVar13 * 2 + 1) & 8) == 0))
      goto LAB_0011c125;
      puVar12 = (ushort *)(((long)*pcVar13 + (long)puVar12 * 10) - 0x30);
      pcVar7 = zSrc + lVar9 + 3;
      if ((pcVar14 <= pcVar7) || ((ushort)(uVar11 - 3) == sVar8)) goto LAB_0011c125;
      if ((*(byte *)((long)puVar6 + (long)*pcVar7 * 2 + 1) & 8) == 0) {
        pcVar7 = pcVar10 + 3;
        goto LAB_0011c125;
      }
      puVar12 = (ushort *)(((long)*pcVar7 + (long)puVar12 * 10) - 0x30);
      lVar3 = lVar9 + 4;
      lVar9 = lVar9 + 4;
    } while ((zSrc + lVar3 < pcVar14) && (pcVar10 = pcVar10 + 4, (ushort)(uVar11 - 4) != sVar8));
    pcVar7 = zSrc + lVar9;
  }
  else {
    puVar12 = (ushort *)0x0;
    pcVar7 = zSrc;
  }
LAB_0011c125:
  if (pcVar7 < pcVar14) {
    ppuVar5 = __ctype_b_loc();
    puVar6 = *ppuVar5;
    bVar2 = *(byte *)((long)puVar6 + (long)*pcVar7 * 2 + 1);
    while (((bVar2 & 0x20) != 0 && (pcVar7 = pcVar7 + 1, pcVar7 < pcVar14))) {
      bVar2 = *(byte *)((long)puVar6 + (long)*pcVar7 * 2 + 1);
    }
  }
  if (pOutVal != (void *)0x0) {
    puVar6 = (ushort *)-(long)puVar12;
    if (puVar12 == (ushort *)0x0) {
      puVar6 = puVar12;
    }
    if (!bVar15) {
      puVar6 = puVar12;
    }
    *(ushort **)pOutVal = puVar6;
  }
  return (sxi32)puVar6;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi64 nVal;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++;
	}
	i = 19;
	if( (sxu32)(zEnd-zSrc) >= 19 ){
		i = SyMemcmp(zSrc, isNeg ? SXINT64_MIN_STR : SXINT64_MAX_STR, 19) <= 0 ? 19 : 18 ;
	}
	nVal = 0;
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}